

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O1

void __thiscall
amrex::MLCellLinOp::fixSolvabilityByOffset
          (MLCellLinOp *this,int amrlev,int mglev,Any *a_rhs,
          Vector<double,_std::allocator<double>_> *offset)

{
  FabFactory<amrex::FArrayBox> *pFVar1;
  uint ncomp;
  MultiFab *this_00;
  long lVar2;
  ulong uVar3;
  Vector<double,_std::allocator<double>_> val;
  allocator_type local_49;
  vector<double,_std::allocator<double>_> local_48;
  value_type_conflict2 local_30;
  
  this_00 = Any::get<amrex::MultiFab>(a_rhs);
  ncomp = (*(this->super_MLLinOp)._vptr_MLLinOp[5])(this);
  if (0 < (int)ncomp) {
    uVar3 = 0;
    do {
      MultiFab::plus(this_00,-(offset->super_vector<double,_std::allocator<double>_>).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar3],(int)uVar3,1,0);
      uVar3 = uVar3 + 1;
    } while (ncomp != uVar3);
  }
  pFVar1 = (this_00->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
  if (pFVar1 != (FabFactory<amrex::FArrayBox> *)0x0) {
    lVar2 = __dynamic_cast(pFVar1,&FabFactory<amrex::FArrayBox>::typeinfo,
                           &EBFArrayBoxFactory::typeinfo,0);
    if (lVar2 != 0) {
      local_30 = 0.0;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_48,(long)(int)ncomp,&local_30,&local_49);
      EB_set_covered(this_00,0,ncomp,(Vector<double,_std::allocator<double>_> *)&local_48);
      if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

void
MLCellLinOp::fixSolvabilityByOffset (int amrlev, int mglev, Any& a_rhs,
                                     Vector<Real> const& offset) const
{
    amrex::ignore_unused(amrlev, mglev);
    AMREX_ASSERT(a_rhs.is<MultiFab>());
    auto& rhs = a_rhs.get<MultiFab>();

    const int ncomp = getNComp();
    for (int c = 0; c < ncomp; ++c) {
        rhs.plus(-offset[c], c, 1);
    }
#ifdef AMREX_USE_EB
    if (rhs.hasEBFabFactory()) {
        Vector<Real> val(ncomp, 0.0_rt);
        amrex::EB_set_covered(rhs, 0, ncomp, val);
    }
#endif
}